

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_dictionary.cpp
# Opt level: O0

int duckdb_brotli::BrotliSharedDictionaryAttach
              (BrotliSharedDictionaryInternal *dict,BrotliSharedDictionaryType type,size_t data_size
              ,uint8_t *data)

{
  uint8_t *data_local;
  size_t data_size_local;
  BrotliSharedDictionaryType type_local;
  BrotliSharedDictionaryInternal *dict_local;
  int local_4;
  
  if (dict == (BrotliSharedDictionaryInternal *)0x0) {
    local_4 = 0;
  }
  else if (type == BROTLI_SHARED_DICTIONARY_RAW) {
    if (dict->num_prefix < 0xf) {
      dict->prefix_size[dict->num_prefix] = data_size;
      dict->prefix[dict->num_prefix] = data;
      dict->num_prefix = dict->num_prefix + 1;
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliSharedDictionaryAttach(
    BrotliSharedDictionary* dict, BrotliSharedDictionaryType type,
    size_t data_size, const uint8_t data[BROTLI_ARRAY_PARAM(data_size)]) {
  if (!dict) {
    return BROTLI_FALSE;
  }
#if defined(BROTLI_EXPERIMENTAL)
  if (type == BROTLI_SHARED_DICTIONARY_SERIALIZED) {
    return DecodeSharedDictionary(data, data_size, dict);
  }
#endif  /* BROTLI_EXPERIMENTAL */
  if (type == BROTLI_SHARED_DICTIONARY_RAW) {
    if (dict->num_prefix >= SHARED_BROTLI_MAX_COMPOUND_DICTS) {
      return BROTLI_FALSE;
    }
    dict->prefix_size[dict->num_prefix] = data_size;
    dict->prefix[dict->num_prefix] = data;
    dict->num_prefix++;
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}